

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O3

void __thiscall bsim::quad_value::print(quad_value *this,ostream *out)

{
  if ((ulong)this->value < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,&DAT_00192f0c + *(int *)(&DAT_00192f0c + (ulong)this->value * 4),1);
    return;
  }
  return;
}

Assistant:

void print(std::ostream& out) const {
      if (value == 1) {
        out << "1";
      } else if (value == 0) {
        out << "0";
      } else if (value == QBV_UNKNOWN_VALUE) {
        out << "x";
      } else if (value == QBV_HIGH_IMPEDANCE_VALUE) {
        out << "z";
      }
    }